

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Error EVar4;
  RegMask RVar5;
  FuncValuePack *this_00;
  FuncValue *pFVar6;
  Operand *pOVar7;
  OperandSignature *pOVar8;
  byte *pbVar9;
  uint *puVar10;
  uint32_t useId;
  uint32_t valueIndex;
  size_t sVar11;
  RAWorkReg *workReg_00;
  RegGroup group;
  uint32_t argIndex;
  ulong argIndex_00;
  bool bVar12;
  RegType local_65;
  Error local_64;
  RAWorkReg *workReg;
  ulong local_58;
  RAInstBuilder *local_50;
  RACFGBuilder *local_48;
  CallConv *local_40;
  Array<asmjit::v1_14::OperandSignature,_32UL> *local_38;
  
  local_40 = (CallConv *)&invokeNode->_funcDetail;
  local_58 = (ulong)(byte)invokeNode->field_0xf4;
  argIndex_00 = 0;
  local_38 = (Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0xec);
  local_64 = 3;
  local_50 = ib;
  local_48 = this;
  do {
    if (argIndex_00 == local_58) {
      bVar12 = false;
LAB_00144a9f:
      if (!bVar12) {
        sVar11 = 0;
        local_64 = 0x19;
        while ((sVar11 != 4 &&
               (pFVar6 = FuncValuePack::operator[]((FuncValuePack *)&invokeNode->field_0x10c,sVar11)
               , pFVar6->_data != 0))) {
          pOVar7 = InvokeNode::OperandPack::operator[](&invokeNode->_rets,sVar11);
          if ((*(char *)((long)&pFVar6->_data + 3) != '\x16') &&
             (((pOVar7->super_Operand_)._signature._bits & 7) == 1)) {
            EVar4 = BaseRAPass::virtIndexAsWorkReg
                              (*(BaseRAPass **)local_48,(pOVar7->super_Operand_)._baseId - 0x100,
                               &workReg);
            if (EVar4 != 0) {
              return EVar4;
            }
            if ((pFVar6->_data >> 8 & 1) == 0) {
              return local_64;
            }
            uVar2 = *(uint *)(CONCAT71(workReg._1_7_,(RegGroup)workReg) + 0x20);
            local_65 = (RegType)(pFVar6->_data >> 0x18);
            pOVar8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0xec)
                                ,&local_65);
            if ((((uVar2 ^ pOVar8->_bits) & 0xf00) == 0) &&
               (EVar4 = RAInstBuilder::addCallRet
                                  (local_50,(RAWorkReg *)CONCAT71(workReg._1_7_,(RegGroup)workReg),
                                   (uint)*(byte *)((long)&pFVar6->_data + 2)), EVar4 != 0)) {
              return EVar4;
            }
          }
          sVar11 = sVar11 + 1;
        }
        local_50 = local_50 + 0x28;
        local_64 = 0;
        for (group = k0; group != kPC; group = group + kVec) {
          workReg._0_1_ = group;
          pbVar9 = RARegCount::operator[]((RARegCount *)(*(long *)local_48 + 0x10c),group);
          bVar1 = *pbVar9;
          RVar5 = CallConv::preservedRegs(local_40,(RegGroup)workReg);
          puVar10 = Support::Array<unsigned_int,_4UL>::operator[]<asmjit::v1_14::RegGroup>
                              ((Array<unsigned_int,_4UL> *)local_50,(RegGroup *)&workReg);
          *puVar10 = ~(RVar5 | (uint)(-1L << (bVar1 & 0x3f)));
        }
      }
      return local_64;
    }
    this_00 = FuncDetail::argPack((FuncDetail *)local_40,argIndex_00);
    for (sVar11 = 0; sVar11 != 4; sVar11 = sVar11 + 1) {
      pFVar6 = FuncValuePack::operator[](this_00,sVar11);
      if (pFVar6->_data != 0) {
        pFVar6 = FuncValuePack::operator[](this_00,sVar11);
        pOVar7 = InvokeNode::arg(invokeNode,argIndex_00,sVar11);
        if (((pOVar7->super_Operand_)._signature._bits & 7) == 1) {
          EVar4 = BaseRAPass::virtIndexAsWorkReg
                            (*(BaseRAPass **)local_48,(pOVar7->super_Operand_)._baseId - 0x100,
                             &workReg);
          if (EVar4 == 0) {
            uVar2 = pFVar6->_data;
            if ((uVar2 >> 10 & 1) == 0) {
              if ((uVar2 >> 8 & 1) != 0) {
                uVar3 = *(uint *)(CONCAT71(workReg._1_7_,(RegGroup)workReg) + 0x20);
                local_65 = (RegType)(uVar2 >> 0x18);
                pOVar8 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>(local_38,&local_65);
                if (((uVar3 ^ pOVar8->_bits) & 0xf00) == 0) {
                  workReg_00 = (RAWorkReg *)CONCAT71(workReg._1_7_,(RegGroup)workReg);
                  useId = (uint32_t)*(byte *)((long)&pFVar6->_data + 2);
                  goto LAB_00144a6d;
                }
              }
              goto LAB_00144a7b;
            }
            workReg_00 = (RAWorkReg *)CONCAT71(workReg._1_7_,(RegGroup)workReg);
            EVar4 = local_64;
            if (((byte)workReg_00[0x21] & 0xf) == 0) {
              useId = uVar2 >> 0x10 & 0xff;
LAB_00144a6d:
              EVar4 = RAInstBuilder::addCallArg(local_50,workReg_00,useId);
              if (EVar4 == 0) goto LAB_00144a7b;
            }
          }
          local_64 = EVar4;
          bVar12 = argIndex_00 < local_58;
          goto LAB_00144a9f;
        }
      }
LAB_00144a7b:
    }
    argIndex_00 = argIndex_00 + 1;
  } while( true );
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    // Not handled here...
    const Operand& op = invokeNode->ret(retIndex);
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  for (RegGroup group : RegGroupVirtValues{})
    ib._clobbered[group] = Support::lsbMask<RegMask>(_pass->_physRegCount[group]) & ~fd.preservedRegs(group);

  return kErrorOk;
}